

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int alsa_get_preferred_sample_rate(cubeb_conflict1 *ctx,uint32_t *rate)

{
  long lVar1;
  snd_pcm_t *psVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  snd_pcm_hw_params_t *__s;
  undefined8 uStack_40;
  snd_pcm_hw_params_t asStack_38 [12];
  int local_2c;
  snd_pcm_t *psStack_28;
  int dir;
  snd_pcm_t *pcm;
  
  uStack_40 = 0x10f658;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  lVar1 = -(sVar5 + 0xf & 0xfffffffffffffff0);
  __s = asStack_38 + lVar1;
  *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f66f;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f67c;
  memset(__s,0,sVar5);
  *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f694;
  iVar3 = (*cubeb_snd_pcm_open)(&stack0xffffffffffffffd8,"default",SND_PCM_STREAM_PLAYBACK,0x10000);
  *(undefined8 *)(asStack_38 + lVar1 + -8) = 0xffffffffffffffff;
  psVar2 = psStack_28;
  iVar4 = (int)*(undefined8 *)(asStack_38 + lVar1 + -8);
  if (-1 < iVar3) {
    *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f6a9;
    iVar3 = (*cubeb_snd_pcm_hw_params_any)(psVar2,__s);
    if (iVar3 < 0) {
      *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f6da;
      (*cubeb_snd_pcm_close)(psStack_28);
    }
    else {
      *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f6bd;
      iVar4 = (*cubeb_snd_pcm_hw_params_get_rate)(__s,rate,&local_2c);
      psVar2 = psStack_28;
      if (iVar4 < 0) {
        *rate = 0xac44;
        *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f6f4;
        iVar4 = (*cubeb_snd_pcm_hw_params_set_rate_near)(psVar2,__s,rate,(int *)0x0);
        *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f701;
        (*cubeb_snd_pcm_close)(psStack_28);
        iVar4 = iVar4 >> 0x1f;
      }
      else {
        *(undefined8 *)(asStack_38 + lVar1 + -8) = 0x10f6cb;
        (*cubeb_snd_pcm_close)(psStack_28);
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
alsa_get_preferred_sample_rate(cubeb * ctx, uint32_t * rate)
{
  (void)ctx;
  int r, dir;
  snd_pcm_t * pcm;
  snd_pcm_hw_params_t * hw_params;

  snd_pcm_hw_params_alloca(&hw_params);

  /* get a pcm, disabling resampling, so we get a rate the
   * hardware/dmix/pulse/etc. supports. */
  r = WRAP(snd_pcm_open)(&pcm, CUBEB_ALSA_PCM_NAME, SND_PCM_STREAM_PLAYBACK,
                         SND_PCM_NO_AUTO_RESAMPLE);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_any)(pcm, hw_params);
  if (r < 0) {
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_get_rate)(hw_params, rate, &dir);
  if (r >= 0) {
    /* There is a default rate: use it. */
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_OK;
  }

  /* Use a common rate, alsa may adjust it based on hw/etc. capabilities. */
  *rate = 44100;

  r = WRAP(snd_pcm_hw_params_set_rate_near)(pcm, hw_params, rate, NULL);
  if (r < 0) {
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_ERROR;
  }

  WRAP(snd_pcm_close)(pcm);

  return CUBEB_OK;
}